

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O3

int RqInterGetMemSizes(int nMaxK,int nMaxExtra,size_t *pInterWorkMemSize,size_t *pInterProgMemSize,
                      size_t *pInterSymNum)

{
  int iVar1;
  long lVar2;
  parameters params;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  
  parameters_get(nMaxK);
  if (local_54 == -1) {
    RqInterGetMemSizes_cold_1();
    iVar1 = -2;
  }
  else {
    if (pInterWorkMemSize != (size_t *)0x0) {
      *pInterWorkMemSize = ((long)nMaxExtra + (long)local_50) * 4 + 0x34;
    }
    if (pInterProgMemSize != (size_t *)0x0) {
      lVar2 = (long)local_40 + (long)local_44 + (long)(int)((long)nMaxExtra + (long)local_50);
      *pInterProgMemSize = (long)(int)lVar2 * (long)local_48 + lVar2 * 4 + 0x28;
    }
    iVar1 = 0;
    if (pInterSymNum != (size_t *)0x0) {
      *pInterSymNum = (long)local_48;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int RqInterGetMemSizes(int nMaxK,
		       int nMaxExtra,
		       size_t* pInterWorkMemSize,
		       size_t* pInterProgMemSize,
		       size_t* pInterSymNum)
{
	/* Compute scheduler size */
	parameters params = parameters_get(nMaxK);
	if (params.K == -1) {
		errmsg("Unsupported K value.");
		return RQ_ERR_EDOM;
	}
	const int maxISIcount = nMaxExtra + params.Kprime;
	if (pInterWorkMemSize != NULL) {
		*pInterWorkMemSize = sizeof(RqInterWorkMem)
					+ maxISIcount * sizeof(uint32_t);
	}

	/* Compute the program size */
	int n_rows = maxISIcount + params.S + params.H;
	int n_cols = params.L;
	if (pInterProgMemSize != NULL) {
		*pInterProgMemSize =
		  sizeof(RqInterProgram)
		  + sizeof(int) * n_rows
		  + n_rows * n_cols;
	}

	/* Intermediate Block Size */
	if (pInterSymNum != NULL) {
		*pInterSymNum = params.L;
	}

	return 0;
}